

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O0

_Bool XPKView_MainLoop(void)

{
  int iVar1;
  int local_68;
  int local_64;
  SDL_Rect dstrect;
  int j;
  int i;
  int win_h;
  int win_w;
  SDL_Event event;
  _Bool want_quit;
  _Bool done;
  
  event.padding[0x37] = '\0';
  event.padding[0x36] = '\0';
  SDL_GetWindowSize(app.window,&i,&j);
  while (((event.padding[0x37] ^ 0xff) & 1) != 0) {
    while (iVar1 = SDL_PollEvent(&win_h), iVar1 != 0) {
      if (win_h == 0x100) {
        event.padding[0x36] = '\x01';
      }
      else if (win_h == 0x300) {
        event.padding[0x36] = XPKView_HandleKeyboard(event.ctouchpad.touchpad);
      }
    }
    if ((event.padding[0x36] & 1) != 0) {
      event.padding[0x37] = '\x01';
    }
    SDL_SetRenderDrawColor(app.renderer,0,0,0);
    SDL_RenderClear(app.renderer);
    if ((app.checkerboard_on & 1U) != 0) {
      for (dstrect.h = 0; dstrect.h < j / 0x20; dstrect.h = dstrect.h + 1) {
        for (dstrect.w = 0; dstrect.w < i / 0x20; dstrect.w = dstrect.w + 1) {
          local_68 = dstrect.w << 5;
          local_64 = dstrect.h << 5;
          dstrect.x = 0x20;
          dstrect.y = 0x20;
          SDL_RenderCopy(app.renderer,app.checkerboard_tx,0,&local_68);
        }
      }
    }
    SDL_RenderCopy(app.renderer,app.xpkentry_tx,0,0x10f708);
    SDL_RenderPresent(app.renderer);
    SDL_Delay(1);
  }
  return true;
}

Assistant:

static bool
XPKView_MainLoop(void)
{
	bool done = false;
	bool want_quit = false;
	SDL_Event event;

	int win_w, win_h;
	SDL_GetWindowSize(app.window, &win_w, &win_h);

	while (!done) {
		while (SDL_PollEvent(&event)) {
			switch (event.type) {
			case SDL_KEYDOWN:
				want_quit = XPKView_HandleKeyboard(event.key.keysym.sym);
				break;
			case SDL_QUIT:
				want_quit = true;
				break;
			default:
				; /* OK */
			}
		}

		if (want_quit) {
			done = true;
		}

		/* Now we can draw stuff. */
		SDL_SetRenderDrawColor(app.renderer, 0, 0, 0, 0);
		SDL_RenderClear(app.renderer);

		if (app.checkerboard_on) {
			for (int i = 0; i < win_h/32; i++) {
				for (int j = 0; j < win_w/32; j++) {
					SDL_Rect dstrect = (SDL_Rect){32*j, 32*i, 32, 32};
					SDL_RenderCopy(app.renderer, app.checkerboard_tx, NULL, &dstrect);
				}
			}
		}

		SDL_RenderCopy(app.renderer, app.xpkentry_tx, NULL, &app.entry_rect);

		SDL_RenderPresent(app.renderer);

		/* LOVE2D does this. It can dramatically reduce CPU usage. */
		SDL_Delay(1);
	}

	return true;
}